

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::Chapters::Edition::Clear(Edition *this)

{
  Atom *pAVar1;
  Atom *this_00;
  int iVar2;
  Atom *a;
  Edition *this_local;
  
  while (0 < this->m_atoms_count) {
    iVar2 = this->m_atoms_count + -1;
    this->m_atoms_count = iVar2;
    Atom::Clear(this->m_atoms + iVar2);
  }
  pAVar1 = this->m_atoms;
  if (pAVar1 != (Atom *)0x0) {
    this_00 = pAVar1 + *(long *)&pAVar1[-1].m_displays_size;
    while (pAVar1 != this_00) {
      this_00 = this_00 + -1;
      Atom::~Atom(this_00);
    }
    operator_delete__(&pAVar1[-1].m_displays_size);
  }
  this->m_atoms = (Atom *)0x0;
  this->m_atoms_size = 0;
  return;
}

Assistant:

void Chapters::Edition::Clear() {
  while (m_atoms_count > 0) {
    Atom& a = m_atoms[--m_atoms_count];
    a.Clear();
  }

  delete[] m_atoms;
  m_atoms = NULL;

  m_atoms_size = 0;
}